

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntryCheckedSrational(TIFF *tif,TIFFDirEntry *direntry,double *value)

{
  TIFFReadDirEntryErr TVar1;
  uint32_t local_38;
  undefined4 local_34;
  uint32_t offset;
  TIFFReadDirEntryErr err;
  UInt64Aligned_t m;
  double *value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  m = (UInt64Aligned_t)value;
  value_local = (double *)direntry;
  direntry_local = (TIFFDirEntry *)tif;
  if ((tif->tif_flags & 0x80000) == 0) {
    local_38 = (direntry->tdir_offset).toff_long;
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong(&local_38);
    }
    TVar1 = TIFFReadDirEntryData((TIFF *)direntry_local,(ulong)local_38,8,&offset);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    local_34 = 0;
  }
  else {
    _offset = (direntry->tdir_offset).toff_long8;
  }
  if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
    TIFFSwabArrayOfLong(&offset,2);
  }
  if ((offset == 0) || (err == TIFFReadDirEntryErrOk)) {
    *(undefined8 *)m = 0;
  }
  else {
    *(double *)m = (double)(int)offset / (double)err;
  }
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryCheckedSrational(TIFF *tif, TIFFDirEntry *direntry,
                                 double *value)
{
    UInt64Aligned_t m;
    assert(sizeof(double) == 8);
    assert(sizeof(uint64_t) == 8);
    assert(sizeof(int32_t) == 4);
    assert(sizeof(uint32_t) == 4);
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        enum TIFFReadDirEntryErr err;
        uint32_t offset = direntry->tdir_offset.toff_long;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&offset);
        err = TIFFReadDirEntryData(tif, offset, 8, m.i);
        if (err != TIFFReadDirEntryErrOk)
            return (err);
    }
    else
        m.l = direntry->tdir_offset.toff_long8;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfLong(m.i, 2);
    /* Not completely sure what we should do when m.i[1]==0, but some */
    /* sanitizers do not like division by 0.0: */
    /* http://bugzilla.maptools.org/show_bug.cgi?id=2644 */
    if ((int32_t)m.i[0] == 0 || m.i[1] == 0)
        *value = 0.0;
    else
        *value = (double)((int32_t)m.i[0]) / (double)m.i[1];
    return (TIFFReadDirEntryErrOk);
}